

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O1

void __thiscall helics::apps::AppTextParser::AppTextParser(AppTextParser *this,string *filename)

{
  pointer pcVar1;
  
  this->mLineComment = false;
  std::ifstream::ifstream(&this->filePtr,(string *)filename,_S_in);
  (this->configStr)._M_dataplus._M_p = (pointer)&(this->configStr).field_2;
  (this->configStr)._M_string_length = 0;
  (this->configStr).field_2._M_local_buf[0] = '\0';
  (this->mFileName)._M_dataplus._M_p = (pointer)&(this->mFileName).field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mFileName,pcVar1,pcVar1 + filename->_M_string_length);
  this->currentLineNumber = 0;
  return;
}

Assistant:

AppTextParser::AppTextParser(const std::string& filename): filePtr(filename), mFileName(filename) {}